

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_first_sibling(lyd_node *node)

{
  lyd_node *plVar1;
  
  if (node != (lyd_node *)0x0) {
    if (node->parent == (lyd_node *)0x0) {
      do {
        plVar1 = node;
        node = plVar1->prev;
      } while (plVar1->prev->next != (lyd_node *)0x0);
    }
    else {
      plVar1 = node->parent->child;
    }
    return plVar1;
  }
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_first_sibling(struct lyd_node *node)
{
    struct lyd_node *start;

    if (!node) {
        return NULL;
    }

    /* get the first sibling */
    if (node->parent) {
        start = node->parent->child;
    } else {
        for (start = node; start->prev->next; start = start->prev);
    }

    return start;
}